

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyCheckUrl(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Bool BVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  Bool hadnonspace;
  Bool isJavascript;
  uint increment;
  uint len;
  uint pos;
  uint i;
  uint bad_codepoint_count;
  uint backslash_count;
  uint escape_count;
  tmbstr p;
  tmbstr dest;
  AttVal *pAStack_20;
  tmbchar c;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bad_codepoint_count = 0;
  i = 0;
  pos = 0;
  increment = 0;
  pAStack_20 = attval;
  attval_local = (AttVal *)node;
  node_local = &doc->root;
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else {
    _backslash_count = attval->value;
    iVar4 = prvTidytmbstrncmp(_backslash_count,"javascript:",0xb);
    for (len = 0; dest._7_1_ = _backslash_count[len], dest._7_1_ != '\0'; len = len + 1) {
      if (dest._7_1_ == '\\') {
        i = i + 1;
        if (((int)node_local[3].next != 0) && (iVar4 != 0)) {
          _backslash_count[len] = '/';
        }
      }
      else if ((('~' < (char)dest._7_1_) || ((char)dest._7_1_ < '!')) ||
              (pcVar9 = strchr("<>",(int)(char)dest._7_1_), pcVar9 != (char *)0x0)) {
        bad_codepoint_count = bad_codepoint_count + 1;
      }
    }
    dest._7_1_ = 0;
    for (; *_backslash_count != '\0'; _backslash_count = _backslash_count + hadnonspace) {
      BVar5 = IsURLCodePoint(_backslash_count,&hadnonspace);
      if (BVar5 == no) {
        pos = pos + 1;
      }
    }
    _backslash_count = pAStack_20->value;
    if (((int)node_local[3].last != 0) && (bad_codepoint_count != 0)) {
      bVar3 = false;
      uVar6 = prvTidytmbstrlen(_backslash_count);
      isJavascript = uVar6 + bad_codepoint_count * 2 + yes;
      uVar1._0_4_ = node_local[0x80].implicit;
      uVar1._4_4_ = node_local[0x80].linebreak;
      p = (tmbstr)(**(code **)**(undefined8 **)&node_local[0x80].implicit)(uVar1,isJavascript);
      for (len = 0; dest._7_1_ = _backslash_count[len], dest._7_1_ != 0; len = len + 1) {
        if ((((char)dest._7_1_ < '\x7f') && (' ' < (char)dest._7_1_)) &&
           (pcVar9 = strchr("<>",(int)(char)dest._7_1_), pcVar9 == (char *)0x0)) {
          bVar3 = true;
          p[increment] = dest._7_1_;
          increment = increment + 1;
        }
        else if (dest._7_1_ == 0x20) {
          if (bVar3) {
            iVar7 = sprintf(p + increment,"%%%02X",0x20);
            increment = iVar7 + increment;
          }
        }
        else {
          iVar7 = sprintf(p + increment,"%%%02X",(ulong)dest._7_1_);
          increment = iVar7 + increment;
          bVar3 = true;
        }
      }
      p[increment] = '\0';
      uVar2._0_4_ = node_local[0x80].implicit;
      uVar2._4_4_ = node_local[0x80].linebreak;
      (**(code **)(**(long **)&node_local[0x80].implicit + 0x10))(uVar2,pAStack_20->value);
      pAStack_20->value = p;
    }
    if (i != 0) {
      if (((int)node_local[3].next == 0) || (iVar4 == 0)) {
        prvTidyReportAttrError((TidyDocImpl *)node_local,(Node *)attval_local,pAStack_20,0x229);
      }
      else {
        prvTidyReportAttrError((TidyDocImpl *)node_local,(Node *)attval_local,pAStack_20,0x240);
      }
    }
    if (bad_codepoint_count != 0) {
      if ((int)node_local[3].last == 0) {
        uVar8 = prvTidyHTMLVersion((TidyDocImpl *)node_local);
        if ((uVar8 & 0x60000) == 0) {
          prvTidyReportAttrError((TidyDocImpl *)node_local,(Node *)attval_local,pAStack_20,0x245);
        }
      }
      else {
        prvTidyReportAttrError((TidyDocImpl *)node_local,(Node *)attval_local,pAStack_20,0x23c);
      }
      node_local[0x80].end = node_local[0x80].end | 0x20;
    }
    if (pos != 0) {
      prvTidyReportAttrError((TidyDocImpl *)node_local,(Node *)attval_local,pAStack_20,0x244);
    }
  }
  return;
}

Assistant:

void TY_(CheckUrl)( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbchar c;
    tmbstr dest, p;
    uint escape_count = 0, backslash_count = 0, bad_codepoint_count = 0;
    uint i, pos = 0;
    uint len;
    uint increment;
    Bool isJavascript = no;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    p = attval->value;

    isJavascript =
        TY_(tmbstrncmp)(p,"javascript:",sizeof("javascript:")-1)==0;

    for (i = 0; '\0' != (c = p[i]); ++i)
    {
        if (c == '\\')
        {
            ++backslash_count;
            if ( cfgBool(doc, TidyFixBackslash) && !isJavascript)
                p[i] = '/';
        }
        else if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            ++escape_count;
    }

    while ( *p != 0 )
    {
        if ( !IsURLCodePoint( p, &increment ) )
            ++bad_codepoint_count;
         p = p + increment;
    }
    p = attval->value;

    if ( cfgBool(doc, TidyFixUri) && escape_count )
    {
        Bool hadnonspace = no;
        len = TY_(tmbstrlen)(p) + escape_count * 2 + 1;
        dest = (tmbstr) TidyDocAlloc(doc, len);
 
        for (i = 0; 0 != (c = p[i]); ++i)
        {
            if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            {
                if (c == 0x20)
                {
                    /* #345 - special case for leading spaces - discard */
                    if (hadnonspace)
                        pos += sprintf( dest + pos, "%%%02X", (byte)c );
                }
                else
                {
                    pos += sprintf( dest + pos, "%%%02X", (byte)c );
                    hadnonspace = yes;
                }
            }
            else
            {
                hadnonspace = yes;
                dest[pos++] = c;
            }
        }
        dest[pos] = 0;

        TidyDocFree(doc, attval->value);
        attval->value = dest;
    }
    if ( backslash_count )
    {
        if ( cfgBool(doc, TidyFixBackslash) && !isJavascript )
            TY_(ReportAttrError)( doc, node, attval, FIXED_BACKSLASH );
        else
            TY_(ReportAttrError)( doc, node, attval, BACKSLASH_IN_URI );
    }
    if ( escape_count )
    {
        if ( cfgBool(doc, TidyFixUri) )
            TY_(ReportAttrError)( doc, node, attval, ESCAPED_ILLEGAL_URI);
        else if ( !(TY_(HTMLVersion)(doc) & VERS_HTML5) )
            TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_REFERENCE);

        doc->badChars |= BC_INVALID_URI;
    }
    if ( bad_codepoint_count )
    {
        TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_CODEPOINT );
    }
}